

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall mjs::object::property::put(property *this,object *self,value *val)

{
  initializer_list<mjs::value> __l;
  bool bVar1;
  value_type vVar2;
  object *poVar3;
  object_ptr *poVar4;
  bool local_271;
  value *local_238;
  bool local_222;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_1e8;
  byte local_1d1;
  undefined1 local_1d0 [24];
  wchar_t *local_1b8;
  allocator<mjs::value> local_1a9;
  value *local_1a8;
  value local_1a0;
  iterator local_178;
  undefined1 local_170 [39];
  byte local_149;
  undefined1 local_148 [56];
  value local_110;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_e8;
  value local_d8;
  undefined1 local_a9;
  undefined1 local_a8 [7];
  bool strict;
  undefined1 local_98 [8];
  value s;
  value local_60;
  undefined1 local_38 [8];
  object_ptr a;
  gc_heap *h;
  value *val_local;
  object *self_local;
  property *this_local;
  
  bVar1 = has_attributes(this->attributes_,read_only);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!has_attributes(attributes_, property_attribute::read_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                  ,0xf4,"void mjs::object::property::put(const object &, const value &)");
  }
  bVar1 = is_accessor(this);
  if (bVar1) {
    a.super_gc_heap_ptr_untyped._8_8_ = object::heap(self);
    value_representation::get_value
              (&local_60,&this->value_,(gc_heap *)a.super_gc_heap_ptr_untyped._8_8_);
    poVar4 = value::object_value(&local_60);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_38,poVar4);
    value::~value(&local_60);
    poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_38);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_a8,L"set");
    (**poVar3->_vptr_object)
              (local_98,poVar3,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_a8);
    poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_38);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_e8,L"__strict__");
    (**poVar3->_vptr_object)(&local_d8,poVar3,&local_e8);
    bVar1 = value::boolean_value(&local_d8);
    local_222 = false;
    if (bVar1) {
      local_222 = is_primitive_object(self);
    }
    value::~value(&local_d8);
    local_a9 = local_222;
    local_149 = 0;
    if (local_222 == false) {
      gc_heap::unsafe_track<mjs::object>
                ((gc_heap *)local_148,(object *)a.super_gc_heap_ptr_untyped._8_8_);
      local_149 = 1;
      value::value((value *)(local_148 + 0x10),(object_ptr *)local_148);
    }
    else {
      (*self->_vptr_object[4])(local_148 + 0x10);
    }
    local_1a8 = &local_1a0;
    value::value(local_1a8,val);
    local_178 = &local_1a0;
    local_170._0_8_ = 4.94065645841247e-324;
    std::allocator<mjs::value>::allocator(&local_1a9);
    __l._M_len = local_170._0_8_;
    __l._M_array = local_178;
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_170 + 8),__l,&local_1a9);
    call_function(&local_110,(value *)local_98,(value *)(local_148 + 0x10),
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_170 + 8));
    value::~value(&local_110);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_170 + 8));
    std::allocator<mjs::value>::~allocator(&local_1a9);
    local_238 = (value *)&local_178;
    do {
      local_238 = local_238 + -1;
      value::~value(local_238);
    } while (local_238 != &local_1a0);
    value::~value((value *)(local_148 + 0x10));
    if ((local_149 & 1) != 0) {
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_148);
    }
    value::~value((value *)local_98);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_38);
  }
  else {
    vVar2 = value::type(val);
    local_1d1 = 0;
    local_271 = true;
    if (vVar2 == object) {
      poVar4 = value::object_value(val);
      gc_heap_ptr<mjs::object>::operator->(poVar4);
      class_name((object *)local_1d0);
      local_1d1 = 1;
      join_0x00000010_0x00000000_ = string::view((string *)local_1d0);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_1e8,L"Accessor");
      local_271 = std::operator!=(stack0xfffffffffffffe40,local_1e8);
    }
    if (local_271 == false) {
      __assert_fail("val.type() != value_type::object || val.object_value()->class_name().view() != L\"Accessor\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0xfc,"void mjs::object::property::put(const object &, const value &)");
    }
    if ((local_1d1 & 1) != 0) {
      string::~string((string *)local_1d0);
    }
    raw_put(this,val);
  }
  return;
}

Assistant:

void object::property::put(const object& self, const value& val) {
    assert(!has_attributes(attributes_, property_attribute::read_only));
    if (is_accessor()) {
        auto& h = self.heap();
        auto a = value_.get_value(h).object_value();
        auto s = a->get(L"set");
        const bool strict = a->get(L"__strict__").boolean_value() && is_primitive_object(self);
        call_function(s, strict ? self.internal_value() : value{h.unsafe_track(self)}, {val});
    } else {
        assert(val.type() != value_type::object || val.object_value()->class_name().view() != L"Accessor");
        raw_put(val);
    }
}